

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterIntel.c
# Opt level: O3

ZyanStatus
ZydisFormatterIntelFormatInstruction
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context)

{
  void **ppvVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  ZydisDecodedOperand *pZVar5;
  ZyanUSize ZVar6;
  ZyanAllocator *pZVar7;
  void *pvVar8;
  ZyanStatus ZVar9;
  ZyanUSize len;
  void *pvVar10;
  ZydisFormatterFunc *pp_Var11;
  ZydisDecorator ZVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  void *pvVar17;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0x30,
                  "ZyanStatus ZydisFormatterIntelFormatInstruction(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0x31,
                  "ZyanStatus ZydisFormatterIntelFormatInstruction(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context == (ZydisFormatterContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0x32,
                  "ZyanStatus ZydisFormatterIntelFormatInstruction(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context->instruction == (ZydisDecodedInstruction *)0x0) {
    __assert_fail("context->instruction",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0x33,
                  "ZyanStatus ZydisFormatterIntelFormatInstruction(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context->operands == (ZydisDecodedOperand *)0x0) {
    __assert_fail("context->operands",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterIntel.c"
                  ,0x34,
                  "ZyanStatus ZydisFormatterIntelFormatInstruction(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  ZVar9 = (*formatter->func_print_prefixes)(formatter,buffer,context);
  if ((-1 < (int)ZVar9) &&
     (ZVar9 = (*formatter->func_print_mnemonic)(formatter,buffer,context), -1 < (int)ZVar9)) {
    if (buffer->is_token_list == '\0') {
      pvVar10 = (void *)(buffer->string).vector.size;
    }
    else {
      pvVar10 = (buffer->string).vector.data;
    }
    ZVar9 = 0x100000;
    if (context->instruction->operand_count_visible != '\0') {
      lVar15 = 0;
      uVar16 = 0;
      do {
        pZVar5 = context->operands;
        if (((lVar15 == 0x50) && (pZVar5[1].type == ZYDIS_OPERAND_TYPE_REGISTER)) &&
           (pZVar5[1].encoding == ZYDIS_OPERAND_ENCODING_MASK)) goto LAB_0011a547;
        if (buffer->is_token_list == '\0') {
          pZVar7 = (buffer->string).vector.allocator;
          pvVar17 = (void *)(buffer->string).vector.size;
          if (pvVar17 == pvVar10) {
            if (pZVar7 != (ZyanAllocator *)0x0) {
LAB_0011a78d:
              __assert_fail("!destination->vector.allocator",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                            ,0xeb,
                            "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)"
                           );
            }
            if (pvVar10 == (void *)0x0) {
LAB_0011a7ac:
              __assert_fail("destination->vector.size && source->size",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                            ,0xec,
                            "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)"
                           );
            }
            if ((buffer->string).vector.capacity < (long)pvVar10 + 1U) {
              return 0x80100009;
            }
            *(undefined2 *)((long)(buffer->string).vector.data + -1 + (long)pvVar10) = 0x20;
            ZVar6 = (buffer->string).vector.size;
            pvVar17 = (buffer->string).vector.data;
            (buffer->string).vector.size = ZVar6 + 1;
            cVar2 = *(char *)((long)pvVar17 + ZVar6);
            pvVar17 = pvVar10;
          }
          else {
            if (pZVar7 != (ZyanAllocator *)0x0) goto LAB_0011a78d;
            if (pvVar17 == (void *)0x0) goto LAB_0011a7ac;
            if ((buffer->string).vector.capacity < (long)pvVar17 + 2U) {
              return 0x80100009;
            }
            pvVar8 = (buffer->string).vector.data;
            *(undefined1 *)((long)pvVar8 + 1 + (long)pvVar17) = 0;
            *(undefined2 *)((long)pvVar8 + -1 + (long)pvVar17) = 0x202c;
            ZVar6 = (buffer->string).vector.size;
            pvVar8 = (buffer->string).vector.data;
            (buffer->string).vector.size = ZVar6 + 2;
            cVar2 = *(char *)((long)pvVar8 + ZVar6 + 1);
          }
          if (cVar2 != '\0') {
            __assert_fail("*(char*)((ZyanU8*)(destination)->vector.data + (destination)->vector.size - 1) == \'\\0\'"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                          ,0xf7,
                          "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)"
                         );
          }
        }
        else {
          ZVar6 = (buffer->string).vector.size;
          pvVar17 = (buffer->string).vector.data;
          if (pvVar10 == pvVar17) {
            if (0xfe < ZVar6 - 1) {
LAB_0011a6d3:
              __assert_fail("(len > 0) && (len < 256)",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/FormatterBase.h"
                            ,0xe7,
                            "ZyanStatus ZydisFormatterBufferAppendPredefined(ZydisFormatterBuffer *, const ZydisPredefinedToken *)"
                           );
            }
            if (buffer->capacity <= ZVar6 + 4) {
              return 0x80100009;
            }
            *(char *)((long)pvVar17 + -1) = (char)ZVar6;
            *(undefined4 *)((long)pvVar17 + ZVar6) = 0x200001;
            lVar13 = 2;
            pvVar17 = pvVar10;
          }
          else {
            if (0xfe < ZVar6 - 1) goto LAB_0011a6d3;
            if (buffer->capacity <= ZVar6 + 8) {
              return 0x80100009;
            }
            *(char *)((long)pvVar17 + -1) = (char)ZVar6;
            *(undefined8 *)((long)pvVar17 + ZVar6) = 0x200001002c0202;
            lVar13 = 6;
          }
          uVar14 = buffer->capacity - (ZVar6 + lVar13);
          buffer->capacity = uVar14;
          ppvVar1 = &(buffer->string).vector.data;
          *ppvVar1 = (void *)((long)*ppvVar1 + ZVar6 + lVar13);
          (buffer->string).vector.size = 2;
          if (0xfe < uVar14) {
            uVar14 = 0xff;
          }
          (buffer->string).vector.capacity = uVar14;
        }
        context->operand = (ZydisDecodedOperand *)(&pZVar5->id + lVar15);
        if (formatter->func_pre_operand == (ZydisFormatterFunc)0x0) {
LAB_0011a4c2:
          pp_Var11 = &formatter->func_format_operand_reg;
          switch(*(undefined4 *)((long)&pZVar5->type + lVar15)) {
          case 1:
            break;
          case 2:
            pp_Var11 = &formatter->func_format_operand_mem;
            break;
          case 3:
            pp_Var11 = &formatter->func_format_operand_ptr;
            break;
          case 4:
            pp_Var11 = &formatter->func_format_operand_imm;
            break;
          default:
            return 0x80100004;
          }
          ZVar9 = (**pp_Var11)(formatter,buffer,context);
          if (ZVar9 == 0x20000b) goto LAB_0011a530;
          if ((int)ZVar9 < 0) {
            return ZVar9;
          }
          if (formatter->func_post_operand != (ZydisFormatterFunc)0x0) {
            ZVar9 = (*formatter->func_post_operand)(formatter,buffer,context);
            if (ZVar9 == 0x20000b) goto LAB_0011a530;
            if (-1 < (int)ZVar9) {
              return ZVar9;
            }
          }
          if ((context->instruction->encoding & ~ZYDIS_INSTRUCTION_ENCODING_3DNOW) ==
              ZYDIS_INSTRUCTION_ENCODING_EVEX) {
            if (((lVar15 == 0) && (1 < context->instruction->operand_count_visible)) &&
               ((context->operands[1].encoding == ZYDIS_OPERAND_ENCODING_MASK &&
                (ZVar9 = (*formatter->func_print_decorator)
                                   (formatter,buffer,context,ZYDIS_DECORATOR_MASK), (int)ZVar9 < 0))
               )) {
              return ZVar9;
            }
            iVar4 = *(int *)((long)&pZVar5->type + lVar15);
            if (iVar4 != 2) {
              bVar3 = context->instruction->operand_count_visible;
              if (uVar16 == bVar3 - 1) {
                if (iVar4 != 4) goto LAB_0011a653;
              }
              else if ((uVar16 + 1 < (ulong)bVar3) &&
                      ((*(int *)((long)&context->operands[1].type + lVar15) == 4 ||
                       (*(int *)((long)&context->operands[1].visibility + lVar15) == 3)))) {
LAB_0011a653:
                if ((context->instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE) &&
                   (ZVar9 = (*formatter->func_print_decorator)
                                      (formatter,buffer,context,ZYDIS_DECORATOR_SWIZZLE),
                   (int)ZVar9 < 0)) {
                  return ZVar9;
                }
                ZVar9 = (*formatter->func_print_decorator)
                                  (formatter,buffer,context,ZYDIS_DECORATOR_RC);
                if ((int)ZVar9 < 0) {
                  return ZVar9;
                }
                ZVar12 = ZYDIS_DECORATOR_SAE;
                goto LAB_0011a69c;
              }
              goto LAB_0011a547;
            }
            ZVar9 = (*formatter->func_print_decorator)(formatter,buffer,context,ZYDIS_DECORATOR_BC);
            if ((int)ZVar9 < 0) {
              return ZVar9;
            }
            if (context->instruction->encoding != ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE)
            goto LAB_0011a547;
            ZVar9 = (*formatter->func_print_decorator)
                              (formatter,buffer,context,ZYDIS_DECORATOR_CONVERSION);
            if ((int)ZVar9 < 0) {
              return ZVar9;
            }
            ZVar12 = ZYDIS_DECORATOR_EH;
LAB_0011a69c:
            ZVar9 = (*formatter->func_print_decorator)(formatter,buffer,context,ZVar12);
            goto joined_r0x0011a6a9;
          }
        }
        else {
          ZVar9 = (*formatter->func_pre_operand)(formatter,buffer,context);
          if (ZVar9 != 0x20000b) {
            if ((int)ZVar9 < 0) {
              return ZVar9;
            }
            goto LAB_0011a4c2;
          }
LAB_0011a530:
          ZVar9 = ZydisFormatterBufferRestore(buffer,(ZyanUPointer)pvVar17);
joined_r0x0011a6a9:
          if ((int)ZVar9 < 0) {
            return ZVar9;
          }
        }
LAB_0011a547:
        uVar16 = uVar16 + 1;
        lVar15 = lVar15 + 0x50;
      } while (uVar16 < context->instruction->operand_count_visible);
      ZVar9 = 0x100000;
    }
  }
  return ZVar9;
}

Assistant:

ZyanStatus ZydisFormatterIntelFormatInstruction(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);
    ZYAN_ASSERT(context->instruction);
    ZYAN_ASSERT(context->operands);

    ZYAN_CHECK(formatter->func_print_prefixes(formatter, buffer, context));
    ZYAN_CHECK(formatter->func_print_mnemonic(formatter, buffer, context));

    ZyanUPointer state_mnemonic;
    ZYDIS_BUFFER_REMEMBER(buffer, state_mnemonic);
    for (ZyanU8 i = 0; i < context->instruction->operand_count_visible; ++i)
    {
        const ZydisDecodedOperand* const operand = &context->operands[i];

        // Print embedded-mask registers as decorator instead of a regular operand
        if ((i == 1) && (operand->type == ZYDIS_OPERAND_TYPE_REGISTER) &&
            (operand->encoding == ZYDIS_OPERAND_ENCODING_MASK))
        {
            continue;
        }

        ZyanUPointer buffer_state;
        ZYDIS_BUFFER_REMEMBER(buffer, buffer_state);

        if (buffer_state != state_mnemonic)
        {
            ZYDIS_BUFFER_APPEND(buffer, DELIM_OPERAND);
        } else
        {
            ZYDIS_BUFFER_APPEND(buffer, DELIM_MNEMONIC);
        }

        // Set current operand
        context->operand = operand;

        ZyanStatus status;
        if (formatter->func_pre_operand)
        {
            status = formatter->func_pre_operand(formatter, buffer, context);
            if (status == ZYDIS_STATUS_SKIP_TOKEN)
            {
                ZYAN_CHECK(ZydisFormatterBufferRestore(buffer, buffer_state));
                continue;
            }
            if (!ZYAN_SUCCESS(status))
            {
                return status;
            }
        }

        switch (operand->type)
        {
        case ZYDIS_OPERAND_TYPE_REGISTER:
            status = formatter->func_format_operand_reg(formatter, buffer, context);
            break;
        case ZYDIS_OPERAND_TYPE_MEMORY:
            status = formatter->func_format_operand_mem(formatter, buffer, context);
            break;
        case ZYDIS_OPERAND_TYPE_POINTER:
            status = formatter->func_format_operand_ptr(formatter, buffer, context);
            break;
        case ZYDIS_OPERAND_TYPE_IMMEDIATE:
            status = formatter->func_format_operand_imm(formatter, buffer, context);
            break;
        default:
            return ZYAN_STATUS_INVALID_ARGUMENT;
        }
        if (status == ZYDIS_STATUS_SKIP_TOKEN)
        {
            ZYAN_CHECK(ZydisFormatterBufferRestore(buffer, buffer_state));
            continue;
        }
        if (!ZYAN_SUCCESS(status))
        {
            return status;
        }

        if (formatter->func_post_operand)
        {
            status = formatter->func_post_operand(formatter, buffer, context);
            if (status == ZYDIS_STATUS_SKIP_TOKEN)
            {
                ZYAN_CHECK(ZydisFormatterBufferRestore(buffer, buffer_state));
                continue;
            }
            if (ZYAN_SUCCESS(status))
            {
                return status;
            }
        }

#if !defined(ZYDIS_DISABLE_AVX512) || !defined(ZYDIS_DISABLE_KNC)
        if ((context->instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_EVEX) ||
            (context->instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_MVEX))
        {
            if  ((i == 0) &&
                 (context->instruction->operand_count_visible > 1) &&
                 (context->operands[i + 1].encoding == ZYDIS_OPERAND_ENCODING_MASK))
            {
                ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                    ZYDIS_DECORATOR_MASK));
            }
            if (operand->type == ZYDIS_OPERAND_TYPE_MEMORY)
            {
                ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                    ZYDIS_DECORATOR_BC));
                if (context->instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_MVEX)
                {
                    ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                        ZYDIS_DECORATOR_CONVERSION));
                    ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                        ZYDIS_DECORATOR_EH));
                }
            } else
            {
                ZyanBool decorate_operand;
                if (i == (context->instruction->operand_count_visible - 1))
                {
                    decorate_operand = operand->type != ZYDIS_OPERAND_TYPE_IMMEDIATE;
                }
                else
                {
                    decorate_operand =
                        (context->instruction->operand_count_visible > (i + 1)) &&
                        ((context->operands[i + 1].type == ZYDIS_OPERAND_TYPE_IMMEDIATE) ||
                        (context->operands[i + 1].visibility == ZYDIS_OPERAND_VISIBILITY_HIDDEN));
                }
                if (decorate_operand)
                {
                    if (context->instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_MVEX)
                    {
                        ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                            ZYDIS_DECORATOR_SWIZZLE));
                    }
                    ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                        ZYDIS_DECORATOR_RC));
                    ZYAN_CHECK(formatter->func_print_decorator(formatter, buffer, context,
                        ZYDIS_DECORATOR_SAE));
                }
            }
        }
#endif
    }

    return ZYAN_STATUS_SUCCESS;
}